

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O3

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uchar *puVar9;
  char chksum [4];
  ogg_page log;
  ogg_page local_50;
  
  if (-1 < oy->storage) {
    puVar9 = oy->data;
    piVar1 = (int *)(puVar9 + oy->returned);
    lVar8 = (long)oy->fill - (long)oy->returned;
    uVar4 = oy->headerbytes;
    uVar7 = (uint)lVar8;
    if (uVar4 == 0) {
      if ((int)uVar7 < 0x1b) {
        return 0;
      }
      if (*piVar1 != 0x5367674f) goto LAB_001e5a07;
      uVar4 = *(byte *)((long)piVar1 + 0x1a) + 0x1b;
      if (uVar7 < uVar4) {
        return 0;
      }
      if (*(byte *)((long)piVar1 + 0x1a) != 0) {
        iVar3 = oy->bodybytes;
        uVar6 = 0;
        do {
          iVar3 = iVar3 + (uint)*(byte *)((long)piVar1 + uVar6 + 0x1b);
          oy->bodybytes = iVar3;
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(byte *)((long)piVar1 + 0x1a));
      }
      oy->headerbytes = uVar4;
    }
    if ((int)(uVar4 + oy->bodybytes) <= (int)uVar7) {
      iVar3 = *(int *)((long)piVar1 + 0x16);
      *(undefined4 *)((long)piVar1 + 0x16) = 0;
      local_50.header_len = (long)oy->headerbytes;
      local_50.body = (uchar *)(local_50.header_len + (long)piVar1);
      local_50.body_len = (long)oy->bodybytes;
      local_50.header = (uchar *)piVar1;
      ogg_page_checksum_set(&local_50);
      if (iVar3 == *(int *)((long)piVar1 + 0x16)) {
        iVar3 = oy->headerbytes;
        iVar2 = oy->bodybytes;
        if (og != (ogg_page *)0x0) {
          og->header = (uchar *)piVar1;
          og->header_len = (long)iVar3;
          og->body = (uchar *)((long)piVar1 + (long)iVar3);
          og->body_len = (long)iVar2;
        }
        oy->unsynced = 0;
        oy->headerbytes = 0;
        iVar3 = iVar3 + iVar2;
        oy->returned = oy->returned + iVar3;
        oy->bodybytes = 0;
        return (long)iVar3;
      }
      *(int *)((long)piVar1 + 0x16) = iVar3;
      puVar9 = oy->data;
LAB_001e5a07:
      oy->headerbytes = 0;
      oy->bodybytes = 0;
      puVar5 = (uchar *)memchr((void *)((long)piVar1 + 1),0x4f,lVar8 - 1);
      if (puVar5 == (uchar *)0x0) {
        puVar5 = puVar9 + oy->fill;
      }
      oy->returned = (int)puVar5 - (int)puVar9;
      return (long)piVar1 - (long)puVar5;
    }
  }
  return 0;
}

Assistant:

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og){
  unsigned char *page=oy->data+oy->returned;
  unsigned char *next;
  long bytes=oy->fill-oy->returned;

  if(ogg_sync_check(oy))return 0;

  if(oy->headerbytes==0){
    int headerbytes,i;
    if(bytes<27)return(0); /* not enough for a header */

    /* verify capture pattern */
    if(memcmp(page,"OggS",4))goto sync_fail;

    headerbytes=page[26]+27;
    if(bytes<headerbytes)return(0); /* not enough for header + seg table */

    /* count up body length in the segment table */

    for(i=0;i<page[26];i++)
      oy->bodybytes+=page[27+i];
    oy->headerbytes=headerbytes;
  }

  if(oy->bodybytes+oy->headerbytes>bytes)return(0);

  /* The whole test page is buffered.  Verify the checksum */
  {
    /* Grab the checksum bytes, set the header field to zero */
    char chksum[4];
    ogg_page log;

    memcpy(chksum,page+22,4);
    memset(page+22,0,4);

    /* set up a temp page struct and recompute the checksum */
    log.header=page;
    log.header_len=oy->headerbytes;
    log.body=page+oy->headerbytes;
    log.body_len=oy->bodybytes;
    ogg_page_checksum_set(&log);

    /* Compare */
    if(memcmp(chksum,page+22,4)){
      /* D'oh.  Mismatch! Corrupt page (or miscapture and not a page
         at all) */
      /* replace the computed checksum with the one actually read in */
      memcpy(page+22,chksum,4);

#ifndef DISABLE_CRC
      /* Bad checksum. Lose sync */
      goto sync_fail;
#endif
    }
  }

  /* yes, have a whole page all ready to go */
  {
    if(og){
      og->header=page;
      og->header_len=oy->headerbytes;
      og->body=page+oy->headerbytes;
      og->body_len=oy->bodybytes;
    }

    oy->unsynced=0;
    oy->returned+=(bytes=oy->headerbytes+oy->bodybytes);
    oy->headerbytes=0;
    oy->bodybytes=0;
    return(bytes);
  }

 sync_fail:

  oy->headerbytes=0;
  oy->bodybytes=0;

  /* search for possible capture */
  next=memchr(page+1,'O',bytes-1);
  if(!next)
    next=oy->data+oy->fill;

  oy->returned=(int)(next-oy->data);
  return((long)-(next-page));
}